

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t Val;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint opc;
  uint imm;
  uint pred;
  uint brtarget;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  Val = fieldFromInstruction_4(in_ESI,0x16,4);
  if ((Val == 0xe) || (Val == 0xf)) {
    uVar2 = fieldFromInstruction_4(in_ESI,4,0x1c);
    if (uVar2 == 0xf3bf8f4) {
      MCInst_setOpcode(in_RDI,0x924);
    }
    else if (uVar2 == 0xf3bf8f5) {
      MCInst_setOpcode(in_RDI,0x923);
    }
    else {
      if (uVar2 != 0xf3bf8f6) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(in_RDI,0x92a);
    }
    uVar3 = fieldFromInstruction_4(in_ESI,0,4);
    local_4 = DecodeMemBarrierOption
                        ((MCInst *)CONCAT44(Val,uVar3),uVar2,(uint64_t)in_stack_ffffffffffffffb8,
                         (void *)0x2a4004);
  }
  else {
    uVar2 = fieldFromInstruction_4(in_ESI,0,0xb);
    uVar4 = uVar2 << 1;
    uVar2 = fieldFromInstruction_4(in_ESI,0xb,1);
    uVar4 = uVar2 << 0x13 | uVar4;
    uVar2 = fieldFromInstruction_4(in_ESI,0xd,1);
    uVar4 = uVar2 << 0x12 | uVar4;
    uVar2 = fieldFromInstruction_4(in_ESI,0x10,6);
    uVar4 = uVar2 << 0xc | uVar4;
    uVar2 = fieldFromInstruction_4(in_ESI,0x1a,1);
    DVar5 = DecodeT2BROperand((MCInst *)CONCAT44(local_4,uVar2 << 0x14 | uVar4),Val,
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
    if (_Var1) {
      DVar5 = DecodePredicateOperand
                        ((MCInst *)CONCAT44(Val,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4
                         ,(uint64_t)in_stack_ffffffffffffffb8,(void *)0x2a40e5);
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
      if (!_Var1) {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned brtarget;
	unsigned pred = fieldFromInstruction_4(Insn, 22, 4);
	if (pred == 0xE || pred == 0xF) {
		unsigned imm;
		unsigned opc = fieldFromInstruction_4(Insn, 4, 28);
		switch (opc) {
			default:
				return MCDisassembler_Fail;
			case 0xf3bf8f4:
				MCInst_setOpcode(Inst, ARM_t2DSB);
				break;
			case 0xf3bf8f5:
				MCInst_setOpcode(Inst, ARM_t2DMB);
				break;
			case 0xf3bf8f6:
				MCInst_setOpcode(Inst, ARM_t2ISB);
				break;
		}

		imm = fieldFromInstruction_4(Insn, 0, 4);
		return DecodeMemBarrierOption(Inst, imm, Address, Decoder);
	}

	brtarget = fieldFromInstruction_4(Insn, 0, 11) << 1;
	brtarget |= fieldFromInstruction_4(Insn, 11, 1) << 19;
	brtarget |= fieldFromInstruction_4(Insn, 13, 1) << 18;
	brtarget |= fieldFromInstruction_4(Insn, 16, 6) << 12;
	brtarget |= fieldFromInstruction_4(Insn, 26, 1) << 20;

	if (!Check(&S, DecodeT2BROperand(Inst, brtarget, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}